

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

void mk_sched_worker_free(mk_server *server)

{
  long *plVar1;
  pthread_t pVar2;
  void *pvVar3;
  long local_30;
  mk_sched_worker *worker;
  mk_sched_ctx *ctx;
  pthread_t tid;
  int i;
  mk_server *server_local;
  
  plVar1 = (long *)server->sched_ctx;
  pthread_mutex_lock((pthread_mutex_t *)&mutex_worker_exit);
  mk_plugin_exit_worker();
  mk_vhost_fdt_worker_exit(server);
  mk_cache_worker_exit();
  pVar2 = pthread_self();
  tid._4_4_ = 0;
  while ((local_30 = 0, tid._4_4_ < server->workers &&
         (local_30 = *plVar1 + (long)tid._4_4_ * 0xa0, *(pthread_t *)(local_30 + 0x38) != pVar2))) {
    tid._4_4_ = tid._4_4_ + 1;
  }
  if (local_30 != 0) {
    pvVar3 = pthread_getspecific(mk_tls_sched_cs);
    mk_mem_free(pvVar3);
    pvVar3 = pthread_getspecific(mk_tls_sched_cs_incomplete);
    mk_mem_free(pvVar3);
    pvVar3 = pthread_getspecific(mk_tls_sched_worker_notif);
    mk_mem_free(pvVar3);
    pthread_mutex_unlock((pthread_mutex_t *)&mutex_worker_exit);
    return;
  }
  mk_print(0x1003,"Bug found in %s() at %s:%d","mk_sched_worker_free",
           "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
           ,0x91);
  abort();
}

Assistant:

void mk_sched_worker_free(struct mk_server *server)
{
    int i;
    pthread_t tid;
    struct mk_sched_ctx *ctx = server->sched_ctx;
    struct mk_sched_worker *worker = NULL;

    pthread_mutex_lock(&mutex_worker_exit);

    /*
     * Fix Me: needs to implement API to make plugins release
     * their resources first at WORKER LEVEL
     */

    /* External */
    mk_plugin_exit_worker();
    mk_vhost_fdt_worker_exit(server);
    mk_cache_worker_exit();

    /* Scheduler stuff */
    tid = pthread_self();
    for (i = 0; i < server->workers; i++) {
        worker = &ctx->workers[i];
        if (worker->tid == tid) {
            break;
        }
        worker = NULL;
    }

    mk_bug(!worker);

    /* FIXME!: there is nothing done here with the worker context */

    /* Free master array (av queue & busy queue) */
    mk_mem_free(MK_TLS_GET(mk_tls_sched_cs));
    mk_mem_free(MK_TLS_GET(mk_tls_sched_cs_incomplete));
    mk_mem_free(MK_TLS_GET(mk_tls_sched_worker_notif));
    pthread_mutex_unlock(&mutex_worker_exit);
}